

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O0

bool __thiscall FilteredLT::ignore_edge(FilteredLT *this,int e)

{
  bool bVar1;
  GraphPropagator *in_RDI;
  int in_stack_ffffffffffffffdc;
  
  GraphPropagator::getEdgeVar(in_RDI,in_stack_ffffffffffffffdc);
  bVar1 = BoolView::isFixed((BoolView *)0x2ab9df);
  if (bVar1) {
    GraphPropagator::getEdgeVar(in_RDI,in_stack_ffffffffffffffdc);
    bVar1 = BoolView::isFalse((BoolView *)in_RDI);
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool FilteredLT::ignore_edge(int e) {
	if (p->getEdgeVar(e).isFixed() && p->getEdgeVar(e).isFalse()) {
		return true;
	}
	return false;
}